

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void __thiscall RTLsTy::UnregisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  iterator __position;
  bool bVar1;
  int32_t iVar2;
  reference ppRVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  int *in_RSI;
  iterator tt;
  __tgt_offload_entry *cur;
  int rc;
  void **dtor;
  iterator __end5;
  iterator __begin5;
  list<void_*,_std::allocator<void_*>_> *__range5;
  DeviceTy *Device;
  int32_t i_1;
  RTLInfoTy *R;
  iterator __end2;
  iterator __begin2;
  vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *__range2;
  RTLInfoTy *FoundRTL;
  __tgt_device_image *img;
  int32_t i;
  int64_t *in_stack_000001f0;
  void **in_stack_000001f8;
  void **in_stack_00000200;
  int32_t in_stack_0000020c;
  void *in_stack_00000210;
  int64_t in_stack_00000218;
  int64_t *in_stack_00000230;
  int32_t in_stack_00000238;
  int32_t in_stack_00000240;
  int in_stack_00000248;
  map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  _Self local_98;
  _Self local_90;
  key_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  _Self local_70;
  _Self local_68;
  list<void_*,_std::allocator<void_*>_> *local_60;
  reference local_58;
  int local_4c;
  RTLInfoTy *local_48;
  RTLInfoTy **local_40;
  __normal_iterator<RTLInfoTy_**,_std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>_> local_38;
  undefined8 local_30;
  RTLInfoTy *local_28;
  void *local_20;
  int local_14;
  int *local_10;
  
  local_10 = in_RSI;
  std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_14 = 0;
  do {
    if (*local_10 <= local_14) {
      std::mutex::unlock((mutex *)0x1080e1);
      std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      for (uVar5 = *(ulong *)(local_10 + 4); uVar5 < *(ulong *)(local_10 + 6); uVar5 = uVar5 + 0x20)
      {
        std::
        map<void_*,_TableMap,_std::less<void_*>,_std::allocator<std::pair<void_*const,_TableMap>_>_>
        ::erase((map<void_*,_TableMap,_std::less<void_*>,_std::allocator<std::pair<void_*const,_TableMap>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (key_type *)in_stack_ffffffffffffff38);
      }
      local_90._M_node =
           (_Base_ptr)
           std::
           map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
           ::find(in_stack_ffffffffffffff38,(key_type *)0x10814a);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
           ::end(in_stack_ffffffffffffff38);
      bVar1 = std::operator!=(&local_90,&local_98);
      if (bVar1) {
        __position._M_node._4_4_ = in_stack_ffffffffffffff4c;
        __position._M_node._0_4_ = in_stack_ffffffffffffff48;
        std::
        map<__tgt_offload_entry*,TranslationTable,std::less<__tgt_offload_entry*>,std::allocator<std::pair<__tgt_offload_entry*const,TranslationTable>>>
        ::erase_abi_cxx11_((map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           __position);
      }
      std::mutex::unlock((mutex *)0x1081a5);
      return;
    }
    local_20 = (void *)(*(long *)(local_10 + 2) + (long)local_14 * 0x20);
    local_28 = (RTLInfoTy *)0x0;
    local_30 = 0x12b268;
    local_38._M_current =
         (RTLInfoTy **)
         std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::begin
                   ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)in_stack_ffffffffffffff38);
    local_40 = (RTLInfoTy **)
               std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>::end
                         ((vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_> *)
                          in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<RTLInfoTy_**,_std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (__normal_iterator<RTLInfoTy_**,_std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>_>
                          *)in_stack_ffffffffffffff38);
      if (!bVar1) goto LAB_001080b0;
      ppRVar3 = __gnu_cxx::
                __normal_iterator<RTLInfoTy_**,_std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>_>
                ::operator*(&local_38);
      local_48 = *ppRVar3;
      iVar2 = (*local_48->is_valid_binary)(local_20);
      if (iVar2 != 0) break;
      __gnu_cxx::
      __normal_iterator<RTLInfoTy_**,_std::vector<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>_>::
      operator++(&local_38);
    }
    local_28 = local_48;
    for (local_4c = 0; local_4c < local_28->NumberOfDevices; local_4c = local_4c + 1) {
      local_58 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[]
                           (&Devices,(long)(local_28->Idx + local_4c));
      std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      pmVar4 = std::
               map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
               ::operator[]((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
      bVar1 = std::__cxx11::list<void_*,_std::allocator<void_*>_>::empty(&pmVar4->PendingCtors);
      if (bVar1) {
        pmVar4 = std::
                 map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                 ::operator[]((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78);
        local_60 = &pmVar4->PendingDtors;
        local_68._M_node =
             (_List_node_base *)
             std::__cxx11::list<void_*,_std::allocator<void_*>_>::begin
                       ((list<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffff38);
        local_70._M_node =
             (_List_node_base *)
             std::__cxx11::list<void_*,_std::allocator<void_*>_>::end
                       ((list<void_*,_std::allocator<void_*>_> *)in_stack_ffffffffffffff38);
        while (bVar1 = std::operator!=(&local_68,&local_70), bVar1) {
          std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)0x108000);
          in_stack_ffffffffffffff38 =
               (map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                *)0x0;
          in_stack_ffffffffffffff40 = 1;
          in_stack_ffffffffffffff48 = 1;
          in_stack_ffffffffffffff84 =
               target(in_stack_00000218,in_stack_00000210,in_stack_0000020c,in_stack_00000200,
                      in_stack_000001f8,in_stack_000001f0,in_stack_00000230,in_stack_00000238,
                      in_stack_00000240,in_stack_00000248);
          std::_List_iterator<void_*>::operator++(&local_68);
        }
        std::
        map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
        ::erase((map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (key_type *)in_stack_ffffffffffffff38);
      }
      std::mutex::unlock((mutex *)0x10808c);
    }
LAB_001080b0:
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void RTLsTy::UnregisterLib(__tgt_bin_desc *desc) {
  DP("Unloading target library!\n");

  RTLsMtx.lock();
  // Find which RTL understands each image, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image. We only need to scan RTLs that are already being used.
    for (auto *R : RTLs.UsedRTLs) {

      assert(R->isUsed && "Expecting used RTLs.");

      if (!R->is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL " DPxMOD "!\n",
            DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      FoundRTL = R;

      // Execute dtors for static objects if the device has been used, i.e.
      // if its PendingCtors list has been emptied.
      for (int32_t i = 0; i < FoundRTL->NumberOfDevices; ++i) {
        DeviceTy &Device = Devices[FoundRTL->Idx + i];
        Device.PendingGlobalsMtx.lock();
        if (Device.PendingCtorsDtors[desc].PendingCtors.empty()) {
          for (auto &dtor : Device.PendingCtorsDtors[desc].PendingDtors) {
            // TODO(Keren): do not monitor these ctors?
            int rc = target(Device.DeviceID, dtor, 0, NULL, NULL, NULL, NULL, 1,
                1, true /*team*/);
            if (rc != OFFLOAD_SUCCESS) {
              DP("Running destructor " DPxMOD " failed.\n", DPxPTR(dtor));
            }
          }
          // Remove this library's entry from PendingCtorsDtors
          Device.PendingCtorsDtors.erase(desc);
        }
        Device.PendingGlobalsMtx.unlock();
      }

      DP("Unregistered image " DPxMOD " from RTL " DPxMOD "!\n",
          DPxPTR(img->ImageStart), DPxPTR(R->LibraryHandler));

      break;
    }

    // if no RTL was found proceed to unregister the next image
    if (!FoundRTL){
      DP("No RTLs in use support the image " DPxMOD "!\n",
          DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();
  DP("Done unregistering images!\n");

  // Remove entries from HostPtrToTableMap
  TblMapMtx.lock();
  for (__tgt_offload_entry *cur = desc->HostEntriesBegin;
      cur < desc->HostEntriesEnd; ++cur) {
    HostPtrToTableMap.erase(cur->addr);
  }

  // Remove translation table for this descriptor.
  auto tt = HostEntriesBeginToTransTable.find(desc->HostEntriesBegin);
  if (tt != HostEntriesBeginToTransTable.end()) {
    DP("Removing translation table for descriptor " DPxMOD "\n",
        DPxPTR(desc->HostEntriesBegin));
    HostEntriesBeginToTransTable.erase(tt);
  } else {
    DP("Translation table for descriptor " DPxMOD " cannot be found, probably "
        "it has been already removed.\n", DPxPTR(desc->HostEntriesBegin));
  }

  TblMapMtx.unlock();

  // TODO: Remove RTL and the devices it manages if it's not used anymore?
  // TODO: Write some RTL->unload_image(...) function?

  DP("Done unregistering library!\n");
}